

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::DenseSupportVectors::_InternalParse
          (DenseSupportVectors *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  ulong uVar3;
  Rep *pRVar4;
  bool bVar5;
  DenseVector *obj;
  MessageLite *msg;
  uint res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar5) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      pbVar6 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar6 * 0x80) - 0x80;
        if ((char)*pbVar6 < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          pbVar6 = (byte *)pVar7.first;
          res = pVar7.second;
        }
        else {
          pbVar6 = local_38 + 2;
        }
      }
      if (res == 10) {
        local_38 = pbVar6 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar4 = (this->vectors_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002bf571:
            obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::DenseVector>
                            ((this->vectors_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->vectors_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar2 = (this->vectors_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar2) goto LAB_002bf571;
            (this->vectors_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (MessageLite *)pRVar4->elements[iVar2];
          }
          local_38 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 10));
      }
      else {
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar6 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar6;
        }
        uVar3 = this_00->ptr_;
        local_38 = pbVar6;
        if ((uVar3 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar3 & 0xfffffffffffffffc) + 8);
        }
        local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_38,ctx);
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar5);
  }
  return (char *)local_38;
}

Assistant:

const char* DenseSupportVectors::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.DenseVector vectors = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_vectors(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}